

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O1

double * MatMul(double *A,int Arow,int Acol,double *B,int Brow,int Bcol)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  double dVar10;
  
  uVar1 = (ulong)(uint)Bcol;
  pdVar2 = (double *)malloc((long)Bcol * (long)Arow * 8);
  if (Acol == Brow) {
    if (0 < Arow) {
      uVar3 = 0;
      uVar4 = 0;
      do {
        if (0 < Bcol) {
          lVar5 = uVar4 * uVar1;
          uVar7 = 0;
          pdVar8 = B;
          do {
            pdVar2[lVar5 + uVar7] = 0.0;
            if (0 < Acol) {
              dVar10 = pdVar2[lVar5 + uVar7];
              uVar9 = 0;
              pdVar6 = pdVar8;
              do {
                dVar10 = dVar10 + A[uVar3 + uVar9] * *pdVar6;
                uVar9 = uVar9 + 1;
                pdVar6 = pdVar6 + uVar1;
              } while ((uint)Acol != uVar9);
              pdVar2[lVar5 + uVar7] = dVar10;
            }
            uVar7 = uVar7 + 1;
            pdVar8 = pdVar8 + 1;
          } while (uVar7 != uVar1);
        }
        uVar4 = uVar4 + 1;
        uVar3 = (ulong)(uint)((int)uVar3 + Acol);
      } while (uVar4 != (uint)Arow);
    }
  }
  else {
    puts(&DAT_0010964f);
    pdVar2 = (double *)0x0;
  }
  return pdVar2;
}

Assistant:

double *MatMul(double *A, int Arow, int Acol, double *B, int Brow, int Bcol) {
    double *Out = (double *) malloc(sizeof(double) * Arow * Bcol);
    if (Acol != Brow) {
        printf("        Shit!矩阵不可乘!\n");
        return NULL;
    }
    if (Acol == Brow) {
        int i, j, k;
        for (i = 0; i < Arow; i++)
            for (j = 0; j < Bcol; j++) {
                Out[Bcol * i + j] = 0;
                for (k = 0; k < Acol; k++)
                    Out[Bcol * i + j] = Out[Bcol * i + j] + A[Acol * i + k] * B[Bcol * k + j];
            }
        return Out;
    }
}